

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logistic_dist.hpp
# Opt level: O0

result_type_conflict3 * __thiscall
trng::logistic_dist<long_double>::icdf(logistic_dist<long_double> *this,result_type_conflict3 x)

{
  undefined1 x_00 [16];
  int *piVar1;
  result_type_conflict3 *prVar2;
  logistic_dist<long_double> *in_RDI;
  longdouble in_stack_00000008;
  undefined1 in_stack_ffffffffffffffd2 [14];
  
  if ((in_stack_00000008 < (longdouble)0) || ((longdouble)1 < in_stack_00000008)) {
    piVar1 = __errno_location();
    *piVar1 = 0x21;
    prVar2 = (result_type_conflict3 *)std::numeric_limits<long_double>::quiet_NaN();
  }
  else if ((in_stack_00000008 != (longdouble)0) || (NAN(in_stack_00000008) || NAN((longdouble)0))) {
    if ((in_stack_00000008 != (longdouble)1) || (NAN(in_stack_00000008) || NAN((longdouble)1))) {
      x_00._2_14_ = in_stack_ffffffffffffffd2;
      x_00._0_2_ = (short)((unkuint10)in_stack_00000008 >> 0x40);
      prVar2 = icdf_(in_RDI,(result_type_conflict3)x_00);
    }
    else {
      prVar2 = (result_type_conflict3 *)std::numeric_limits<long_double>::infinity();
    }
  }
  else {
    prVar2 = (result_type_conflict3 *)std::numeric_limits<long_double>::infinity();
  }
  return prVar2;
}

Assistant:

icdf(result_type x) const {
      if (x < 0 or x > 1) {
#if !(defined TRNG_CUDA)
        errno = EDOM;
#endif
        return math::numeric_limits<result_type>::quiet_NaN();
      }
      if (x == 0)
        return -math::numeric_limits<result_type>::infinity();
      if (x == 1)
        return math::numeric_limits<result_type>::infinity();
      return icdf_(x);
    }